

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O2

Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> __thiscall
kj::MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
          (MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this,Mutex *param_2)

{
  Impl *extraout_RDX;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> LVar1;
  
  kj::_::Mutex::lock(param_2,1);
  *(Mutex **)&this->mutex = param_2;
  (this->mutex).waitersHead.ptr = (Waiter *)(param_2 + 1);
  LVar1.ptr = extraout_RDX;
  LVar1.mutex = &this->mutex;
  return LVar1;
}

Assistant:

inline Locked<const T> MutexGuarded<T>::lockShared(LockSourceLocationArg location) const {
  mutex.lock(_::Mutex::SHARED, kj::none, location);
  return Locked<const T>(mutex, value);
}